

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::ILikeOperatorASCII,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ValidityMask *local_48;
  bool *local_40;
  ulong local_38;
  
  local_58 = count;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar12 = 8;
      iVar9 = 0;
      do {
        local_70 = *(ulong *)((long)ldata + lVar12 + -8);
        local_68 = *(char **)((long)&ldata->value + lVar12);
        local_80 = *(ulong *)((long)rdata + lVar12 + -8);
        local_78 = *(char **)((long)&rdata->value + lVar12);
        pcVar10 = local_68;
        if ((uint)local_70 < 0xd) {
          pcVar10 = (char *)((long)&local_70 + 4);
        }
        pcVar4 = local_78;
        if ((uint)local_80 < 0xd) {
          pcVar4 = (char *)((long)&local_80 + 4);
        }
        bVar2 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::ASCIILCaseReader>
                          (pcVar10,local_70 & 0xffffffff,pcVar4,local_80 & 0xffffffff,'\0');
        result_data[iVar9] = bVar2;
        iVar9 = iVar9 + 1;
        lVar12 = lVar12 + 0x10;
      } while (local_58 != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = count + 0x3f >> 6;
    local_60 = 0;
    uVar5 = 0;
    local_50 = uVar3;
    local_48 = mask;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar5 + 0x40;
        if (local_58 <= uVar5 + 0x40) {
          uVar7 = local_58;
        }
LAB_014dd954:
        uVar8 = uVar5;
        if (uVar5 < uVar7) {
          uVar6 = uVar5 << 4 | 8;
          do {
            local_70 = *(ulong *)((long)ldata + (uVar6 - 8));
            local_68 = *(char **)((long)&ldata->value + uVar6);
            local_80 = *(ulong *)((long)rdata + (uVar6 - 8));
            local_78 = *(char **)((long)&rdata->value + uVar6);
            pcVar10 = local_68;
            if ((uint)local_70 < 0xd) {
              pcVar10 = (char *)((long)&local_70 + 4);
            }
            pcVar4 = local_78;
            if ((uint)local_80 < 0xd) {
              pcVar4 = (char *)((long)&local_80 + 4);
            }
            bVar2 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::ASCIILCaseReader>
                              (pcVar10,local_70 & 0xffffffff,pcVar4,local_80 & 0xffffffff,'\0');
            result_data[uVar5] = bVar2;
            uVar5 = uVar5 + 1;
            uVar6 = uVar6 + 0x10;
            uVar3 = local_50;
            uVar8 = uVar7;
            mask = local_48;
          } while (uVar7 != uVar5);
        }
      }
      else {
        uVar6 = puVar1[local_60];
        uVar7 = uVar5 + 0x40;
        if (local_58 <= uVar5 + 0x40) {
          uVar7 = local_58;
        }
        uVar8 = uVar7;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) goto LAB_014dd954;
          local_38 = uVar7 - uVar5;
          uVar8 = uVar5;
          if (uVar5 <= uVar7 && local_38 != 0) {
            local_40 = result_data + uVar5;
            uVar11 = uVar5 << 4 | 8;
            uVar5 = 0;
            do {
              if ((uVar6 >> (uVar5 & 0x3f) & 1) != 0) {
                local_70 = *(ulong *)((long)ldata + (uVar11 - 8));
                local_68 = *(char **)((long)&ldata->value + uVar11);
                local_80 = *(ulong *)((long)rdata + (uVar11 - 8));
                local_78 = *(char **)((long)&rdata->value + uVar11);
                pcVar10 = local_68;
                if ((uint)local_70 < 0xd) {
                  pcVar10 = (char *)((long)&local_70 + 4);
                }
                pcVar4 = local_78;
                if ((uint)local_80 < 0xd) {
                  pcVar4 = (char *)((long)&local_80 + 4);
                }
                bVar2 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::ASCIILCaseReader>
                                  (pcVar10,local_70 & 0xffffffff,pcVar4,local_80 & 0xffffffff,'\0');
                local_40[uVar5] = bVar2;
              }
              uVar5 = uVar5 + 1;
              uVar11 = uVar11 + 0x10;
              uVar3 = local_50;
              uVar8 = uVar7;
              mask = local_48;
            } while (local_38 != uVar5);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar5 = uVar8;
    } while (local_60 != uVar3);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}